

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpWithTcpServer::KcpWithTcpServer
          (KcpWithTcpServer *this,KcpTcpEventLoop *loop,InetAddress *listenAddr,
          vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *udpListenAddrs,
          string *nameArg,int kcpMode,Option option)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  KcpTcpEventLoop *pKVar3;
  Acceptor *pAVar4;
  KcpTcpEventLoopThreadPool *this_00;
  undefined4 in_register_0000008c;
  SourceFile file;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string *local_40;
  int local_34;
  
  file._8_8_ = 0x10;
  file.m_data = (char *)0x14;
  local_34 = kcpMode;
  pKVar3 = CheckNotNull<sznet::net::KcpTcpEventLoop>
                     ((sznet *)0x140e06,file,0x13f62d,(char *)loop,
                      (KcpTcpEventLoop *)CONCAT44(in_register_0000008c,kcpMode));
  this->m_loop = pKVar3;
  InetAddress::toIpPort_abi_cxx11_(&this->m_ipPort,listenAddr);
  local_40 = &this->m_name;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + nameArg->_M_string_length);
  pAVar4 = (Acceptor *)operator_new(0xf0);
  Acceptor::Acceptor(pAVar4,&loop->super_EventLoop,listenAddr,option == kReusePort);
  (this->m_acceptor)._M_t.
  super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>.
  super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl = pAVar4;
  this_00 = (KcpTcpEventLoopThreadPool *)operator_new(0x80);
  KcpTcpEventLoopThreadPool::KcpTcpEventLoopThreadPool(this_00,loop,udpListenAddrs,local_40);
  (this->m_threadPool).
  super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sznet::net::KcpTcpEventLoopThreadPool*>
            (&(this->m_threadPool).
              super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor + 8) = 0
  ;
  (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpWriteCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_threadInitCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_threadInitCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_threadInitCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_threadInitCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpConnectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_started = (__atomic_base<int>)0x0;
  this->m_nextConnId = 1;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
            (&this->m_udpListenAddrs,udpListenAddrs);
  local_60._8_8_ = 0;
  local_60._M_unused._M_object = operator_new(0x18);
  *(code **)local_60._M_unused._0_8_ = tcpMessage;
  *(undefined8 *)((long)local_60._M_unused._0_8_ + 8) = 0;
  local_48 = std::
             _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>_>
             ::_M_invoke;
  *(KcpWithTcpServer **)((long)local_60._M_unused._0_8_ + 0x10) = this;
  local_50 = std::
             _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>_>
             ::_M_manager;
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::function(&(this->m_tcpCodec).m_messageCallback,
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
              *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  this->m_kcpMode = local_34;
  pAVar4 = (this->m_acceptor)._M_t.
           super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>
           .super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl;
  local_60._8_8_ = 0;
  local_60._M_unused._M_object = operator_new(0x18);
  *(code **)local_60._M_unused._0_8_ = newConnection;
  *(undefined8 *)((long)local_60._M_unused._0_8_ + 8) = 0;
  local_48 = std::
             _Function_handler<void_(int,_const_sznet::net::InetAddress_&),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_sznet::net::InetAddress_&)>_>
             ::_M_invoke;
  *(KcpWithTcpServer **)((long)local_60._M_unused._0_8_ + 0x10) = this;
  local_50 = std::
             _Function_handler<void_(int,_const_sznet::net::InetAddress_&),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_sznet::net::InetAddress_&)>_>
             ::_M_manager;
  std::function<void_(int,_const_sznet::net::InetAddress_&)>::operator=
            (&pAVar4->m_newConnectionCallback,
             (function<void_(int,_const_sznet::net::InetAddress_&)> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

KcpWithTcpServer::KcpWithTcpServer(KcpTcpEventLoop* loop, const InetAddress& listenAddr, const std::vector<InetAddress>& udpListenAddrs, const string& nameArg, int kcpMode, Option option) :
	m_loop(CHECK_NOTNULL(loop)),
	m_ipPort(listenAddr.toIpPort()),
	m_name(nameArg),
	m_acceptor(new Acceptor(loop, listenAddr, option == kReusePort)),
	m_threadPool(new KcpTcpEventLoopThreadPool(loop, udpListenAddrs, m_name)),
	m_started(0),
	m_nextConnId(1),
	m_udpListenAddrs(udpListenAddrs),
	m_tcpCodec(std::bind(&KcpWithTcpServer::tcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_kcpMode(kcpMode)
{
	m_acceptor->setNewConnectionCallback(std::bind(&KcpWithTcpServer::newConnection, this, std::placeholders::_1, std::placeholders::_2));
}